

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O1

void libcmepoll_LTX_select_shutdown(CMtrans_services_conflict svc,CManager cm,void *client_data)

{
  select_data_ptr sd;
  pthread_t pVar1;
  pthread_t pVar2;
  
  sd = *client_data;
  (*svc->verbose)(sd->cm,CMSelectVerbose,"CMSelect Shutdown task called");
  pVar1 = sd->server_thread;
  pVar2 = pthread_self();
  if (pVar1 == pVar2) {
    return;
  }
  sd->closed = 1;
  close(sd->epfd);
  wake_server_thread(sd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_select_shutdown(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMSelectVerbose, "CMSelect Shutdown task called");
    if (sd->server_thread != thr_thread_self()) {
	sd->closed = 1;
	close(sd->epfd);
	wake_server_thread(sd);
    }
}